

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O0

bool __thiscall BamTools::Internal::BamStandardIndex::Load(BamStandardIndex *this,string *filename)

{
  BamStandardIndex *in_RDI;
  BamException *e;
  BamStandardIndex *in_stack_000000b0;
  OpenMode in_stack_000000f4;
  string *in_stack_000000f8;
  BamStandardIndex *in_stack_00000100;
  
  OpenFile(in_stack_00000100,in_stack_000000f8,in_stack_000000f4);
  CheckMagicNumber(in_stack_000000b0);
  SummarizeIndexFile(in_RDI);
  return true;
}

Assistant:

bool BamStandardIndex::Load(const std::string& filename)
{

    try {

        // attempt to open file (read-only)
        OpenFile(filename, IBamIODevice::ReadOnly);

        // validate format
        CheckMagicNumber();

        // load in-memory summary of index data
        SummarizeIndexFile();

        // return success
        return true;

    } catch (BamException& e) {
        m_errorString = e.what();
        return false;
    }
}